

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::IncompleteCubeFormatCase::createTexture(IncompleteCubeFormatCase *this)

{
  uint uVar1;
  GLenum GVar2;
  uint uVar3;
  uint uVar4;
  GLsizei width;
  GLenum *pGVar5;
  ulong uVar6;
  IncompleteCubeFormatCase *pIVar7;
  GLsizei height;
  deUint32 format;
  bool bVar8;
  GLuint texture;
  IncompleteCubeFormatCase *local_a0;
  TextureLevel levelData;
  TextureFormat fmt;
  undefined1 local_68 [16];
  PixelBufferAccess local_58;
  
  fmt = glu::mapGLTransferFormat(0x1908,0x1401);
  tcu::TextureLevel::TextureLevel(&levelData,&fmt);
  glwGenTextures(1,&texture);
  glwPixelStorei(0xcf5,1);
  glwBindTexture(0x8513,texture);
  glwTexParameteri(0x8513,0x2802,0x2901);
  glwTexParameteri(0x8513,0x2803,0x2901);
  glwTexParameteri(0x8513,0x2801,0x2700);
  glwTexParameteri(0x8513,0x2800,0x2600);
  uVar4 = (this->m_size).m_data[0];
  uVar1 = 0x20;
  uVar3 = 0x20;
  if (uVar4 != 0) {
    uVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar3 = uVar3 ^ 0x1f;
  }
  uVar4 = (this->m_size).m_data[1];
  if (uVar4 != 0) {
    uVar1 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    uVar1 = uVar1 ^ 0x1f;
  }
  uVar4 = 0x1f - uVar1;
  if ((int)(0x1f - uVar1) < (int)(0x1f - uVar3)) {
    uVar4 = 0x1f - uVar3;
  }
  if (uVar4 < 0x7fffffff) {
    uVar3 = 0;
    local_a0 = this;
    do {
      pIVar7 = local_a0;
      tcu::TextureLevel::setSize
                (&levelData,(local_a0->m_size).m_data[0],(local_a0->m_size).m_data[1],1);
      tcu::TextureLevel::getAccess(&local_58,&levelData);
      local_68._0_4_ = 0.0;
      local_68._4_4_ = 0.0;
      local_68._8_8_ = &DAT_3f8000003f800000;
      tcu::clear(&local_58,(Vec4 *)local_68);
      width = (pIVar7->m_size).m_data[0] >> ((byte)uVar3 & 0x1f);
      if (width < 2) {
        width = 1;
      }
      height = (pIVar7->m_size).m_data[1] >> ((byte)uVar3 & 0x1f);
      if (height < 2) {
        height = 1;
      }
      pGVar5 = &s_cubeTargets;
      uVar6 = 0;
      do {
        format = *(deUint32 *)&(pIVar7->super_TexCubeCompletenessCase).field_0x84;
        if (uVar3 == 0) {
          if (uVar6 == pIVar7->m_invalidCubeFace) {
            format = pIVar7->m_invalidFormat;
          }
          if ((ulong)pIVar7->m_invalidCubeFace == 6) {
            format = pIVar7->m_invalidFormat;
          }
        }
        GVar2 = *pGVar5;
        tcu::TextureLevel::getAccess(&local_58,&levelData);
        glwTexImage2D(GVar2,uVar3,format,width,height,0,format,0x1401,
                      local_58.super_ConstPixelBufferAccess.m_data);
        uVar6 = uVar6 + 1;
        pGVar5 = pGVar5 + 1;
        pIVar7 = local_a0;
      } while (uVar6 != 6);
      bVar8 = uVar3 != uVar4;
      uVar3 = uVar3 + 1;
    } while (bVar8);
  }
  GVar2 = glwGetError();
  glu::checkError(GVar2,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureCompletenessTests.cpp"
                  ,0x2c2);
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void IncompleteCubeFormatCase::createTexture (void)
{
	tcu::TextureFormat	fmt			= glu::mapGLTransferFormat(GL_RGBA, GL_UNSIGNED_BYTE);
	tcu::TextureLevel	levelData	(fmt);

	GLuint texture;
	glGenTextures	(1, &texture);
	glPixelStorei	(GL_UNPACK_ALIGNMENT, 1);
	glBindTexture	(GL_TEXTURE_CUBE_MAP, texture);

	glTexParameteri	(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S,		GL_REPEAT);
	glTexParameteri	(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T,		GL_REPEAT);
	glTexParameteri	(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER,	GL_NEAREST_MIPMAP_NEAREST);
	glTexParameteri	(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);

	int numLevels = 1 + de::max(deLog2Floor32(m_size.x()), deLog2Floor32(m_size.y()));

	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		levelData.setSize(m_size.x(), m_size.y());
		clear(levelData.getAccess(), tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f));

		int	levelW = de::max(1, m_size.x() >> levelNdx);
		int	levelH = de::max(1, m_size.y() >> levelNdx);

		for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(s_cubeTargets); targetNdx++)
		{
			deUint32 format = m_format;
			if (levelNdx == 0 && (m_invalidCubeFace == tcu::CUBEFACE_LAST || m_invalidCubeFace == targetNdx))
				format = m_invalidFormat;

			glTexImage2D(s_cubeTargets[targetNdx], levelNdx, format, levelW, levelH, 0, format, GL_UNSIGNED_BYTE, levelData.getAccess().getDataPtr());
		}
	}

	GLU_CHECK_MSG("Set texturing state");
}